

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source_location.hpp
# Opt level: O3

string * toml::detail::format_underline
                   (string *__return_storage_ptr__,string *message,
                   vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *loc_com,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *helps,bool colorize)

{
  size_t __n;
  pointer pbVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *lc;
  long lVar5;
  ostream *poVar6;
  long lVar7;
  ulong uVar8;
  pointer ppVar9;
  pointer pbVar10;
  ulong uVar11;
  uint_least32_t uVar12;
  size_t sVar13;
  ostream *poVar14;
  anon_class_8_1_5e3eab80 format_one_location;
  ostringstream retval;
  char *local_1f0;
  long local_1e8;
  char local_1e0;
  undefined7 uStack_1df;
  vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_1d0;
  anon_class_8_1_5e3eab80 local_1c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_1c0;
  string *local_1b8;
  long local_1b0;
  long local_1a8 [14];
  ios_base local_138 [80];
  uint auStack_e8 [2];
  long alStack_e0 [22];
  
  uVar8 = 0;
  for (ppVar9 = (loc_com->
                super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      ppVar9 != (loc_com->
                super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish; ppVar9 = ppVar9 + 1) {
    uVar12 = (ppVar9->first).line_num_;
    uVar11 = 0;
    if (uVar12 != 0) {
      do {
        uVar11 = uVar11 + 1;
        bVar2 = 9 < uVar12;
        uVar12 = uVar12 / 10;
      } while (bVar2);
    }
    if (uVar8 <= uVar11) {
      uVar8 = uVar11;
    }
  }
  sVar13 = uVar8 + (uVar8 == 0);
  local_1d0 = loc_com;
  local_1c0 = helps;
  local_1b8 = __return_storage_ptr__;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  iVar3 = (int)(ostringstream *)local_1a8;
  if ((colorize | color_ansi::detail::color_mode::status()::status_) == 1) {
    lVar5 = *(long *)(local_1a8[0] + -0x18);
    if (color_ansi::detail::colorize_index()::index == '\0') {
      format_underline();
    }
    if (color_ansi::detail::colorize_index()::index < *(uint *)((long)auStack_e8 + lVar5)) {
      lVar5 = (long)(int)color_ansi::detail::colorize_index()::index * 0x10 +
              *(long *)((long)alStack_e0 + lVar5);
    }
    else {
      lVar5 = std::ios_base::_M_grow_words
                        ((int)lVar5 + iVar3,SUB41(color_ansi::detail::colorize_index()::index,0));
    }
    *(undefined8 *)(lVar5 + 8) = 1;
  }
  if (7 < message->_M_string_length) {
    std::__cxx11::string::substr((ulong)&local_1f0,(ulong)message);
    iVar4 = std::__cxx11::string::compare((char *)&local_1f0);
    if (local_1f0 != &local_1e0) {
      operator_delete(local_1f0,CONCAT71(uStack_1df,local_1e0) + 1);
    }
    if (iVar4 == 0) {
      lVar5 = *(long *)(local_1a8[0] + -0x18);
      if (color_ansi::detail::colorize_index()::index == '\0') {
        format_underline();
      }
      if (color_ansi::detail::colorize_index()::index < *(uint *)((long)auStack_e8 + lVar5)) {
        lVar5 = (long)(int)color_ansi::detail::colorize_index()::index * 0x10 +
                *(long *)((long)alStack_e0 + lVar5);
      }
      else {
        lVar5 = std::ios_base::_M_grow_words
                          ((int)lVar5 + iVar3,SUB41(color_ansi::detail::colorize_index()::index,0));
      }
      if (*(long *)(lVar5 + 8) == 1) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\x1b[01m",5);
      }
      lVar5 = *(long *)(local_1a8[0] + -0x18);
      if (color_ansi::detail::colorize_index()::index == '\0') {
        format_underline();
      }
      if (color_ansi::detail::colorize_index()::index < *(uint *)((long)auStack_e8 + lVar5)) {
        lVar5 = (long)(int)color_ansi::detail::colorize_index()::index * 0x10 +
                *(long *)((long)alStack_e0 + lVar5);
      }
      else {
        lVar5 = std::ios_base::_M_grow_words
                          ((int)lVar5 + iVar3,SUB41(color_ansi::detail::colorize_index()::index,0));
      }
      if (*(long *)(lVar5 + 8) == 1) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\x1b[31m",5);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
      lVar5 = *(long *)(local_1a8[0] + -0x18);
      iVar4 = (int)(ostream *)local_1a8;
      if (color_ansi::detail::colorize_index()::index == '\0') {
        format_underline();
      }
      if (color_ansi::detail::colorize_index()::index < *(uint *)((long)auStack_e8 + lVar5)) {
        lVar5 = (long)(int)color_ansi::detail::colorize_index()::index * 0x10 +
                *(long *)((long)alStack_e0 + lVar5);
      }
      else {
        lVar5 = std::ios_base::_M_grow_words
                          ((int)lVar5 + iVar4,SUB41(color_ansi::detail::colorize_index()::index,0));
      }
      if (*(long *)(lVar5 + 8) == 1) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\x1b[00m",5);
      }
      lVar5 = *(long *)(local_1a8[0] + -0x18);
      if (color_ansi::detail::colorize_index()::index == '\0') {
        format_underline();
      }
      if (color_ansi::detail::colorize_index()::index < *(uint *)((long)auStack_e8 + lVar5)) {
        lVar5 = (long)(int)color_ansi::detail::colorize_index()::index * 0x10 +
                *(long *)((long)alStack_e0 + lVar5);
      }
      else {
        lVar5 = std::ios_base::_M_grow_words
                          (iVar4 + (int)lVar5,SUB41(color_ansi::detail::colorize_index()::index,0));
      }
      if (*(long *)(lVar5 + 8) == 1) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\x1b[01m",5);
      }
      std::__cxx11::string::substr((ulong)&local_1f0,(ulong)message);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,local_1f0,local_1e8);
      poVar14 = poVar6 + *(long *)(*(long *)poVar6 + -0x18);
      if (color_ansi::detail::colorize_index()::index == '\0') {
        format_underline();
      }
      if (color_ansi::detail::colorize_index()::index < *(uint *)(poVar14 + 0xc0)) {
        lVar5 = (long)(int)color_ansi::detail::colorize_index()::index * 0x10 +
                *(long *)(poVar14 + 200);
      }
      else {
        lVar5 = std::ios_base::_M_grow_words
                          ((int)poVar14,SUB41(color_ansi::detail::colorize_index()::index,0));
      }
      if (*(long *)(lVar5 + 8) == 1) {
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[00m",5);
      }
      local_1c8.line_num_width._0_1_ = 10;
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)&local_1c8,1);
      if (local_1f0 != &local_1e0) {
        operator_delete(local_1f0,CONCAT71(uStack_1df,local_1e0) + 1);
      }
      goto LAB_0011c1c5;
    }
  }
  lVar5 = *(long *)(local_1a8[0] + -0x18);
  if (color_ansi::detail::colorize_index()::index == '\0') {
    format_underline();
  }
  if (color_ansi::detail::colorize_index()::index < *(uint *)((long)auStack_e8 + lVar5)) {
    lVar5 = (long)(int)color_ansi::detail::colorize_index()::index * 0x10 +
            *(long *)((long)alStack_e0 + lVar5);
  }
  else {
    lVar5 = std::ios_base::_M_grow_words
                      ((int)lVar5 + iVar3,SUB41(color_ansi::detail::colorize_index()::index,0));
  }
  if (*(long *)(lVar5 + 8) == 1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\x1b[01m",5);
  }
  lVar5 = *(long *)(local_1a8[0] + -0x18);
  if (color_ansi::detail::colorize_index()::index == '\0') {
    format_underline();
  }
  if (color_ansi::detail::colorize_index()::index < *(uint *)((long)auStack_e8 + lVar5)) {
    lVar5 = (long)(int)color_ansi::detail::colorize_index()::index * 0x10 +
            *(long *)((long)alStack_e0 + lVar5);
  }
  else {
    lVar5 = std::ios_base::_M_grow_words
                      ((int)lVar5 + iVar3,SUB41(color_ansi::detail::colorize_index()::index,0));
  }
  if (*(long *)(lVar5 + 8) == 1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\x1b[31m",5);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error] ",8);
  lVar5 = *(long *)(local_1a8[0] + -0x18);
  iVar4 = (int)(ostream *)local_1a8;
  if (color_ansi::detail::colorize_index()::index == '\0') {
    format_underline();
  }
  if (color_ansi::detail::colorize_index()::index < *(uint *)((long)auStack_e8 + lVar5)) {
    lVar5 = (long)(int)color_ansi::detail::colorize_index()::index * 0x10 +
            *(long *)((long)alStack_e0 + lVar5);
  }
  else {
    lVar5 = std::ios_base::_M_grow_words
                      ((int)lVar5 + iVar4,SUB41(color_ansi::detail::colorize_index()::index,0));
  }
  if (*(long *)(lVar5 + 8) == 1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\x1b[00m",5);
  }
  lVar5 = *(long *)(local_1a8[0] + -0x18);
  if (color_ansi::detail::colorize_index()::index == '\0') {
    format_underline();
  }
  if (color_ansi::detail::colorize_index()::index < *(uint *)((long)auStack_e8 + lVar5)) {
    lVar5 = (long)(int)color_ansi::detail::colorize_index()::index * 0x10 +
            *(long *)((long)alStack_e0 + lVar5);
  }
  else {
    lVar5 = std::ios_base::_M_grow_words
                      (iVar4 + (int)lVar5,SUB41(color_ansi::detail::colorize_index()::index,0));
  }
  if (*(long *)(lVar5 + 8) == 1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\x1b[01m",5);
  }
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,(message->_M_dataplus)._M_p,message->_M_string_length);
  poVar14 = poVar6 + *(long *)(*(long *)poVar6 + -0x18);
  if (color_ansi::detail::colorize_index()::index == '\0') {
    format_underline();
  }
  if (color_ansi::detail::colorize_index()::index < *(uint *)(poVar14 + 0xc0)) {
    lVar5 = (long)(int)color_ansi::detail::colorize_index()::index * 0x10 + *(long *)(poVar14 + 200)
    ;
  }
  else {
    lVar5 = std::ios_base::_M_grow_words
                      ((int)poVar14,SUB41(color_ansi::detail::colorize_index()::index,0));
  }
  if (*(long *)(lVar5 + 8) == 1) {
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[00m",5);
  }
  local_1f0 = (char *)CONCAT71(local_1f0._1_7_,10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)&local_1f0,1);
LAB_0011c1c5:
  local_1c8.line_num_width = sVar13;
  if ((local_1d0->
      super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start ==
      (local_1d0->
      super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
LAB_0011d011:
    __assert_fail("!loc_com.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/toml11/toml/source_location.hpp"
                  ,0xbc,
                  "std::string toml::detail::format_underline(const std::string &, const std::vector<std::pair<source_location, std::string>> &, const std::vector<std::string> &, const bool)"
                 );
  }
  lVar5 = *(long *)(local_1a8[0] + -0x18);
  if (color_ansi::detail::colorize_index()::index == '\0') {
    format_underline();
  }
  if (color_ansi::detail::colorize_index()::index < *(uint *)((long)auStack_e8 + lVar5)) {
    lVar5 = (long)(int)color_ansi::detail::colorize_index()::index * 0x10 +
            *(long *)((long)alStack_e0 + lVar5);
  }
  else {
    lVar5 = std::ios_base::_M_grow_words
                      ((int)lVar5 + iVar3,SUB41(color_ansi::detail::colorize_index()::index,0));
  }
  if (*(long *)(lVar5 + 8) == 1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\x1b[01m",5);
  }
  lVar5 = *(long *)(local_1a8[0] + -0x18);
  if (color_ansi::detail::colorize_index()::index == '\0') {
    format_underline();
  }
  if (color_ansi::detail::colorize_index()::index < *(uint *)((long)auStack_e8 + lVar5)) {
    lVar5 = (long)(int)color_ansi::detail::colorize_index()::index * 0x10 +
            *(long *)((long)alStack_e0 + lVar5);
  }
  else {
    lVar5 = std::ios_base::_M_grow_words
                      (iVar3 + (int)lVar5,SUB41(color_ansi::detail::colorize_index()::index,0));
  }
  if (*(long *)(lVar5 + 8) == 1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\x1b[34m",5);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," --> ",5);
  lVar5 = *(long *)(local_1a8[0] + -0x18);
  if (color_ansi::detail::colorize_index()::index == '\0') {
    format_underline();
  }
  if (color_ansi::detail::colorize_index()::index < *(uint *)((long)auStack_e8 + lVar5)) {
    lVar5 = (long)(int)color_ansi::detail::colorize_index()::index * 0x10 +
            *(long *)((long)alStack_e0 + lVar5);
  }
  else {
    lVar5 = std::ios_base::_M_grow_words
                      ((int)(ostream *)local_1a8 + (int)lVar5,
                       SUB41(color_ansi::detail::colorize_index()::index,0));
  }
  if (*(long *)(lVar5 + 8) == 1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\x1b[00m",5);
  }
  ppVar9 = (local_1d0->
           super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,(ppVar9->first).file_name_._M_dataplus._M_p,
                      (ppVar9->first).file_name_._M_string_length);
  local_1f0 = (char *)CONCAT71(local_1f0._1_7_,10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)&local_1f0,1);
  local_1b0 = sVar13 + 1;
  local_1f0 = &local_1e0;
  if (local_1b0 == 0) {
    local_1e8 = 0;
    local_1e0 = '\0';
  }
  else {
    std::__cxx11::string::_M_construct((ulong)&local_1f0,(char)local_1b0);
  }
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,local_1f0,local_1e8);
  poVar14 = poVar6 + *(long *)(*(long *)poVar6 + -0x18);
  if (color_ansi::detail::colorize_index()::index == '\0') {
    format_underline();
  }
  if (color_ansi::detail::colorize_index()::index < *(uint *)(poVar14 + 0xc0)) {
    lVar5 = (long)(int)color_ansi::detail::colorize_index()::index * 0x10 + *(long *)(poVar14 + 200)
    ;
  }
  else {
    lVar5 = std::ios_base::_M_grow_words
                      ((int)poVar14,SUB41(color_ansi::detail::colorize_index()::index,0));
  }
  if (*(long *)(lVar5 + 8) == 1) {
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[01m",5);
  }
  poVar14 = poVar6 + *(long *)(*(long *)poVar6 + -0x18);
  if (color_ansi::detail::colorize_index()::index == '\0') {
    format_underline();
  }
  if (color_ansi::detail::colorize_index()::index < *(uint *)(poVar14 + 0xc0)) {
    lVar5 = (long)(int)color_ansi::detail::colorize_index()::index * 0x10 + *(long *)(poVar14 + 200)
    ;
  }
  else {
    lVar5 = std::ios_base::_M_grow_words
                      ((int)poVar14,SUB41(color_ansi::detail::colorize_index()::index,0));
  }
  if (*(long *)(lVar5 + 8) == 1) {
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[34m",5);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," |\n",3);
  poVar14 = poVar6 + *(long *)(*(long *)poVar6 + -0x18);
  if (color_ansi::detail::colorize_index()::index == '\0') {
    format_underline();
  }
  if (color_ansi::detail::colorize_index()::index < *(uint *)(poVar14 + 0xc0)) {
    lVar5 = (long)(int)color_ansi::detail::colorize_index()::index * 0x10 + *(long *)(poVar14 + 200)
    ;
  }
  else {
    lVar5 = std::ios_base::_M_grow_words
                      ((int)poVar14,SUB41(color_ansi::detail::colorize_index()::index,0));
  }
  if (*(long *)(lVar5 + 8) == 1) {
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[00m",5);
  }
  if (local_1f0 != &local_1e0) {
    operator_delete(local_1f0,CONCAT71(uStack_1df,local_1e0) + 1);
  }
  ppVar9 = (local_1d0->
           super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  format_underline::anon_class_8_1_5e3eab80::operator()
            (&local_1c8,(ostringstream *)local_1a8,&ppVar9->first,&ppVar9->second);
  ppVar9 = (local_1d0->
           super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar8 = ((long)(local_1d0->
                 super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish - (long)ppVar9 >> 4) *
          0x6db6db6db6db6db7;
  if (1 < uVar8) {
    uVar11 = 1;
    lVar5 = 0x70;
    do {
      if (uVar8 <= uVar11 - 1) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
        goto LAB_0011d011;
      }
      local_1f0 = (char *)CONCAT71(local_1f0._1_7_,10);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,(char *)&local_1f0,1);
      __n = *(size_t *)((long)ppVar9 + lVar5 + -0x58);
      iVar3 = (int)(ostream *)local_1a8;
      if ((__n == *(size_t *)((long)&(ppVar9->first).file_name_._M_string_length + lVar5)) &&
         ((__n == 0 ||
          (iVar4 = bcmp(*(void **)((long)ppVar9 + lVar5 + -0x60),
                        *(void **)((long)&(ppVar9->first).file_name_._M_dataplus + lVar5),__n),
          iVar4 == 0)))) {
        lVar7 = *(long *)(local_1a8[0] + -0x18);
        if (color_ansi::detail::colorize_index()::index == '\0') {
          format_underline();
        }
        if (color_ansi::detail::colorize_index()::index < *(uint *)((long)auStack_e8 + lVar7)) {
          lVar7 = (long)(int)color_ansi::detail::colorize_index()::index * 0x10 +
                  *(long *)((long)alStack_e0 + lVar7);
        }
        else {
          lVar7 = std::ios_base::_M_grow_words
                            ((int)lVar7 + iVar3,SUB41(color_ansi::detail::colorize_index()::index,0)
                            );
        }
        if (*(long *)(lVar7 + 8) == 1) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\x1b[01m",5);
        }
        lVar7 = *(long *)(local_1a8[0] + -0x18);
        if (color_ansi::detail::colorize_index()::index == '\0') {
          format_underline();
        }
        if (color_ansi::detail::colorize_index()::index < *(uint *)((long)auStack_e8 + lVar7)) {
          lVar7 = (long)(int)color_ansi::detail::colorize_index()::index * 0x10 +
                  *(long *)((long)alStack_e0 + lVar7);
        }
        else {
          lVar7 = std::ios_base::_M_grow_words
                            ((int)lVar7 + iVar3,SUB41(color_ansi::detail::colorize_index()::index,0)
                            );
        }
        if (*(long *)(lVar7 + 8) == 1) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\x1b[34m",5);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ...\n",5);
        lVar7 = *(long *)(local_1a8[0] + -0x18);
        if (color_ansi::detail::colorize_index()::index == '\0') {
          format_underline();
        }
        if (color_ansi::detail::colorize_index()::index < *(uint *)((long)auStack_e8 + lVar7)) {
          lVar7 = (long)(int)color_ansi::detail::colorize_index()::index * 0x10 +
                  *(long *)((long)alStack_e0 + lVar7);
        }
        else {
          lVar7 = std::ios_base::_M_grow_words
                            ((int)lVar7 + iVar3,SUB41(color_ansi::detail::colorize_index()::index,0)
                            );
        }
        if (*(long *)(lVar7 + 8) == 1) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\x1b[00m",5);
        }
      }
      else {
        lVar7 = *(long *)(local_1a8[0] + -0x18);
        if (color_ansi::detail::colorize_index()::index == '\0') {
          format_underline();
        }
        if (color_ansi::detail::colorize_index()::index < *(uint *)((long)auStack_e8 + lVar7)) {
          lVar7 = (long)(int)color_ansi::detail::colorize_index()::index * 0x10 +
                  *(long *)((long)alStack_e0 + lVar7);
        }
        else {
          lVar7 = std::ios_base::_M_grow_words
                            ((int)lVar7 + iVar3,SUB41(color_ansi::detail::colorize_index()::index,0)
                            );
        }
        if (*(long *)(lVar7 + 8) == 1) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\x1b[01m",5);
        }
        lVar7 = *(long *)(local_1a8[0] + -0x18);
        if (color_ansi::detail::colorize_index()::index == '\0') {
          format_underline();
        }
        if (color_ansi::detail::colorize_index()::index < *(uint *)((long)auStack_e8 + lVar7)) {
          lVar7 = (long)(int)color_ansi::detail::colorize_index()::index * 0x10 +
                  *(long *)((long)alStack_e0 + lVar7);
        }
        else {
          lVar7 = std::ios_base::_M_grow_words
                            ((int)lVar7 + iVar3,SUB41(color_ansi::detail::colorize_index()::index,0)
                            );
        }
        if (*(long *)(lVar7 + 8) == 1) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\x1b[34m",5);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," --> ",5);
        lVar7 = *(long *)(local_1a8[0] + -0x18);
        if (color_ansi::detail::colorize_index()::index == '\0') {
          format_underline();
        }
        if (color_ansi::detail::colorize_index()::index < *(uint *)((long)auStack_e8 + lVar7)) {
          lVar7 = (long)(int)color_ansi::detail::colorize_index()::index * 0x10 +
                  *(long *)((long)alStack_e0 + lVar7);
        }
        else {
          lVar7 = std::ios_base::_M_grow_words
                            ((int)lVar7 + iVar3,SUB41(color_ansi::detail::colorize_index()::index,0)
                            );
        }
        if (*(long *)(lVar7 + 8) == 1) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\x1b[00m",5);
        }
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,
                            *(char **)((long)&(ppVar9->first).file_name_._M_dataplus + lVar5),
                            *(long *)((long)&(ppVar9->first).file_name_._M_string_length + lVar5));
        local_1f0 = (char *)CONCAT71(local_1f0._1_7_,10);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)&local_1f0,1);
        local_1f0 = &local_1e0;
        if (local_1b0 == 0) {
          local_1e8 = 0;
          local_1e0 = '\0';
        }
        else {
          std::__cxx11::string::_M_construct((ulong)&local_1f0,(char)local_1b0);
        }
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,local_1f0,local_1e8);
        poVar14 = poVar6 + *(long *)(*(long *)poVar6 + -0x18);
        if (color_ansi::detail::colorize_index()::index == '\0') {
          format_underline();
        }
        if (color_ansi::detail::colorize_index()::index < *(uint *)(poVar14 + 0xc0)) {
          lVar7 = (long)(int)color_ansi::detail::colorize_index()::index * 0x10 +
                  *(long *)(poVar14 + 200);
        }
        else {
          lVar7 = std::ios_base::_M_grow_words
                            ((int)poVar14,SUB41(color_ansi::detail::colorize_index()::index,0));
        }
        if (*(long *)(lVar7 + 8) == 1) {
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[01m",5);
        }
        poVar14 = poVar6 + *(long *)(*(long *)poVar6 + -0x18);
        if (color_ansi::detail::colorize_index()::index == '\0') {
          format_underline();
        }
        if (color_ansi::detail::colorize_index()::index < *(uint *)(poVar14 + 0xc0)) {
          lVar7 = (long)(int)color_ansi::detail::colorize_index()::index * 0x10 +
                  *(long *)(poVar14 + 200);
        }
        else {
          lVar7 = std::ios_base::_M_grow_words
                            ((int)poVar14,SUB41(color_ansi::detail::colorize_index()::index,0));
        }
        if (*(long *)(lVar7 + 8) == 1) {
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[34m",5);
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar6," |\n",3);
        poVar14 = poVar6 + *(long *)(*(long *)poVar6 + -0x18);
        if (color_ansi::detail::colorize_index()::index == '\0') {
          format_underline();
        }
        if (color_ansi::detail::colorize_index()::index < *(uint *)(poVar14 + 0xc0)) {
          lVar7 = (long)(int)color_ansi::detail::colorize_index()::index * 0x10 +
                  *(long *)(poVar14 + 200);
        }
        else {
          lVar7 = std::ios_base::_M_grow_words
                            ((int)poVar14,SUB41(color_ansi::detail::colorize_index()::index,0));
        }
        if (*(long *)(lVar7 + 8) == 1) {
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[00m",5);
        }
        if (local_1f0 != &local_1e0) {
          operator_delete(local_1f0,CONCAT71(uStack_1df,local_1e0) + 1);
        }
      }
      format_underline::anon_class_8_1_5e3eab80::operator()
                (&local_1c8,(ostringstream *)local_1a8,
                 (source_location *)((long)&(ppVar9->first).line_num_ + lVar5),
                 (string *)((long)&(ppVar9->second)._M_dataplus._M_p + lVar5));
      uVar11 = uVar11 + 1;
      ppVar9 = (local_1d0->
               super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      uVar8 = ((long)(local_1d0->
                     super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish - (long)ppVar9 >> 4) *
              0x6db6db6db6db6db7;
      lVar5 = lVar5 + 0x70;
    } while (uVar11 < uVar8);
  }
  if ((local_1c0->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start !=
      (local_1c0->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    local_1f0 = (char *)CONCAT71(local_1f0._1_7_,10);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,(char *)&local_1f0,1);
    local_1f0 = &local_1e0;
    if (local_1b0 == 0) {
      local_1e8 = 0;
      local_1e0 = '\0';
    }
    else {
      std::__cxx11::string::_M_construct((ulong)&local_1f0,(char)local_1b0);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,local_1f0,local_1e8);
    if (local_1f0 != &local_1e0) {
      operator_delete(local_1f0,CONCAT71(uStack_1df,local_1e0) + 1);
    }
    lVar5 = *(long *)(local_1a8[0] + -0x18);
    iVar3 = (int)(ostream *)local_1a8;
    if (color_ansi::detail::colorize_index()::index == '\0') {
      format_underline();
    }
    if (color_ansi::detail::colorize_index()::index < *(uint *)((long)auStack_e8 + lVar5)) {
      lVar5 = (long)(int)color_ansi::detail::colorize_index()::index * 0x10 +
              *(long *)((long)alStack_e0 + lVar5);
    }
    else {
      lVar5 = std::ios_base::_M_grow_words
                        ((int)lVar5 + iVar3,SUB41(color_ansi::detail::colorize_index()::index,0));
    }
    if (*(long *)(lVar5 + 8) == 1) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\x1b[01m",5);
    }
    lVar5 = *(long *)(local_1a8[0] + -0x18);
    if (color_ansi::detail::colorize_index()::index == '\0') {
      format_underline();
    }
    if (color_ansi::detail::colorize_index()::index < *(uint *)((long)auStack_e8 + lVar5)) {
      lVar5 = (long)(int)color_ansi::detail::colorize_index()::index * 0x10 +
              *(long *)((long)alStack_e0 + lVar5);
    }
    else {
      lVar5 = std::ios_base::_M_grow_words
                        (iVar3 + (int)lVar5,SUB41(color_ansi::detail::colorize_index()::index,0));
    }
    if (*(long *)(lVar5 + 8) == 1) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\x1b[34m",5);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," |",2);
    lVar5 = *(long *)(local_1a8[0] + -0x18);
    iVar3 = (int)(ostream *)local_1a8;
    if (color_ansi::detail::colorize_index()::index == '\0') {
      format_underline();
    }
    if (color_ansi::detail::colorize_index()::index < *(uint *)((long)auStack_e8 + lVar5)) {
      lVar5 = (long)(int)color_ansi::detail::colorize_index()::index * 0x10 +
              *(long *)((long)alStack_e0 + lVar5);
    }
    else {
      lVar5 = std::ios_base::_M_grow_words
                        ((int)lVar5 + iVar3,SUB41(color_ansi::detail::colorize_index()::index,0));
    }
    if (*(long *)(lVar5 + 8) == 1) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\x1b[00m",5);
    }
    pbVar1 = (local_1c0->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    for (pbVar10 = (local_1c0->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start; pbVar10 != pbVar1;
        pbVar10 = pbVar10 + 1) {
      lVar5 = *(long *)(local_1a8[0] + -0x18);
      if (color_ansi::detail::colorize_index()::index == '\0') {
        format_underline();
      }
      if (color_ansi::detail::colorize_index()::index < *(uint *)((long)auStack_e8 + lVar5)) {
        lVar5 = (long)(int)color_ansi::detail::colorize_index()::index * 0x10 +
                *(long *)((long)alStack_e0 + lVar5);
      }
      else {
        lVar5 = std::ios_base::_M_grow_words
                          ((int)lVar5 + iVar3,SUB41(color_ansi::detail::colorize_index()::index,0));
      }
      if (*(long *)(lVar5 + 8) == 1) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\x1b[01m",5);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\nHint: ",7);
      lVar5 = *(long *)(local_1a8[0] + -0x18);
      if (color_ansi::detail::colorize_index()::index == '\0') {
        format_underline();
      }
      if (color_ansi::detail::colorize_index()::index < *(uint *)((long)auStack_e8 + lVar5)) {
        lVar5 = (long)(int)color_ansi::detail::colorize_index()::index * 0x10 +
                *(long *)((long)alStack_e0 + lVar5);
      }
      else {
        lVar5 = std::ios_base::_M_grow_words
                          ((int)lVar5 + iVar3,SUB41(color_ansi::detail::colorize_index()::index,0));
      }
      if (*(long *)(lVar5 + 8) == 1) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\x1b[00m",5);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,(pbVar10->_M_dataplus)._M_p,pbVar10->_M_string_length);
    }
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  return local_1b8;
}

Assistant:

inline std::string format_underline(const std::string& message,
        const std::vector<std::pair<source_location, std::string>>& loc_com,
        const std::vector<std::string>& helps = {},
        const bool colorize = TOML11_ERROR_MESSAGE_COLORIZED)
{
    std::size_t line_num_width = 0;
    for(const auto& lc : loc_com)
    {
        std::uint_least32_t line = lc.first.line();
        std::size_t        digit = 0;
        while(line != 0)
        {
            line  /= 10;
            digit +=  1;
        }
        line_num_width = (std::max)(line_num_width, digit);
    }
    // 1 is the minimum width
    line_num_width = std::max<std::size_t>(line_num_width, 1);

    std::ostringstream retval;

    if(color::should_color() || colorize)
    {
        retval << color::colorize; // turn on ANSI color
    }

    // XXX
    // Here, before `colorize` support, it does not output `[error]` prefix
    // automatically. So some user may output it manually and this change may
    // duplicate the prefix. To avoid it, check the first 7 characters and
    // if it is "[error]", it removes that part from the message shown.
    if(message.size() > 7 && message.substr(0, 7) == "[error]")
    {
        retval
#ifndef TOML11_NO_ERROR_PREFIX
               << color::bold << color::red << "[error]" << color::reset
#endif
               << color::bold << message.substr(7) << color::reset << '\n';
    }
    else
    {
        retval
#ifndef TOML11_NO_ERROR_PREFIX
               << color::bold << color::red << "[error] " << color::reset
#endif
               << color::bold << message << color::reset << '\n';
    }

    const auto format_one_location = [line_num_width]
        (std::ostringstream& oss,
         const source_location& loc, const std::string& comment) -> void
        {
            oss << ' ' << color::bold << color::blue
                << std::setw(static_cast<int>(line_num_width))
                << std::right << loc.line() << " | "  << color::reset
                << loc.line_str() << '\n';

            oss << make_string(line_num_width + 1, ' ')
                << color::bold << color::blue << " | " << color::reset
                << make_string(loc.column()-1 /*1-origin*/, ' ');

            if(loc.region() == 1)
            {
                // invalid
                // ^------
                oss << color::bold << color::red << "^---" << color::reset;
            }
            else
            {
                // invalid
                // ~~~~~~~
                const auto underline_len = (std::min)(
                    static_cast<std::size_t>(loc.region()), loc.line_str().size());
                oss << color::bold << color::red
                    << make_string(underline_len, '~') << color::reset;
            }
            oss << ' ';
            oss << comment;
            return;
        };

    assert(!loc_com.empty());

    // --> example.toml
    //   |
    retval << color::bold << color::blue << " --> " << color::reset
           << loc_com.front().first.file_name() << '\n';
    retval << make_string(line_num_width + 1, ' ')
           << color::bold << color::blue << " |\n"  << color::reset;
    // 1 | key value
    //   |    ^--- missing =
    format_one_location(retval, loc_com.front().first, loc_com.front().second);

    // process the rest of the locations
    for(std::size_t i=1; i<loc_com.size(); ++i)
    {
        const auto& prev = loc_com.at(i-1);
        const auto& curr = loc_com.at(i);

        retval << '\n';
        // if the filenames are the same, print "..."
        if(prev.first.file_name() == curr.first.file_name())
        {
            retval << color::bold << color::blue << " ...\n" << color::reset;
        }
        else // if filename differs, print " --> filename.toml" again
        {
            retval << color::bold << color::blue << " --> " << color::reset
                   << curr.first.file_name() << '\n';
            retval << make_string(line_num_width + 1, ' ')
                   << color::bold << color::blue << " |\n"  << color::reset;
        }

        format_one_location(retval, curr.first, curr.second);
    }

    if(!helps.empty())
    {
        retval << '\n';
        retval << make_string(line_num_width + 1, ' ');
        retval << color::bold << color::blue << " |" << color::reset;
        for(const auto& help : helps)
        {
            retval << color::bold << "\nHint: " << color::reset;
            retval << help;
        }
    }
    return retval.str();
}